

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O0

bool __thiscall vkb::SystemInfo::is_layer_available(SystemInfo *this,char *layer_name)

{
  char *layer_name_local;
  SystemInfo *this_local;
  
  if (layer_name == (char *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ = detail::check_layer_supported(&this->available_layers,layer_name);
  }
  return this_local._7_1_;
}

Assistant:

bool SystemInfo::is_layer_available(const char* layer_name) const {
    if (!layer_name) return false;
    return detail::check_layer_supported(available_layers, layer_name);
}